

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib597.c
# Opt level: O1

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  char *pcVar9;
  timeval tVar10;
  int maxfd;
  int running;
  long timeout;
  timeval interval;
  int msgs_left;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  int local_1f8;
  int local_1f4;
  ulong local_1f0;
  long local_1e8;
  timeval local_1e0;
  undefined8 local_1d0;
  char *local_1c8;
  undefined1 local_1bc [4];
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  tv_test_start = tutil_tvnow();
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    uVar4 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                  ,0x3d,iVar2,uVar4);
  }
  if (iVar2 == 0) {
    lVar5 = curl_easy_init();
    if (lVar5 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                    ,0x3f);
      iVar2 = 0x7c;
      lVar6 = 0;
    }
    else {
      lVar6 = curl_multi_init();
      if (lVar6 == 0) {
        curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                      ,0x41);
        iVar2 = 0x7b;
      }
      else {
        local_1f0 = 0;
        local_1c8 = URL;
        do {
          iVar3 = curl_easy_setopt(lVar5,0x29,1);
          uVar1 = _stderr;
          iVar2 = 0;
          if (iVar3 != 0) {
            uVar4 = curl_easy_strerror(iVar3);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                          ,0x45,iVar3,uVar4);
            iVar2 = iVar3;
          }
          if (iVar2 != 0) break;
          iVar3 = curl_easy_setopt(lVar5,0x2712,local_1c8);
          uVar1 = _stderr;
          iVar2 = 0;
          if (iVar3 != 0) {
            uVar4 = curl_easy_strerror(iVar3);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                          ,0x48,iVar3,uVar4);
            iVar2 = iVar3;
          }
          if (iVar2 != 0) break;
          if ((local_1f0 & 1) == 0) {
            iVar3 = curl_easy_setopt(lVar5,0x8d,1);
            uVar1 = _stderr;
            iVar2 = 0;
            if (iVar3 != 0) {
              uVar4 = curl_easy_strerror(iVar3);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                            ,0x4c,iVar3,uVar4);
              iVar2 = iVar3;
            }
            if (iVar2 != 0) break;
            if ((int)local_1f0 != 0) goto LAB_001024c2;
          }
          else {
LAB_001024c2:
            iVar3 = curl_easy_setopt(lVar5,0x8d,0);
            uVar1 = _stderr;
            iVar2 = 0;
            if (iVar3 != 0) {
              uVar4 = curl_easy_strerror(iVar3);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                            ,0x50,iVar3,uVar4);
              iVar2 = iVar3;
            }
            if (iVar2 != 0) break;
            iVar3 = curl_easy_setopt(lVar5,0x2c,1);
            uVar1 = _stderr;
            iVar2 = 0;
            if (iVar3 != 0) {
              uVar4 = curl_easy_strerror(iVar3);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                            ,0x51,iVar3,uVar4);
              iVar2 = iVar3;
            }
            if (iVar2 != 0) break;
            iVar3 = curl_easy_setopt(lVar5,0x4b,1);
            uVar1 = _stderr;
            iVar2 = 0;
            if (iVar3 != 0) {
              uVar4 = curl_easy_strerror(iVar3);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                            ,0x52,iVar3,uVar4);
              iVar2 = iVar3;
            }
            if (iVar2 != 0) break;
          }
          iVar2 = curl_multi_add_handle(lVar6,lVar5);
          uVar1 = _stderr;
          if (iVar2 == 0) {
            iVar2 = 0;
          }
          else {
            uVar4 = curl_multi_strerror(iVar2);
            curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                          ,0x55,iVar2,uVar4);
          }
          if (iVar2 != 0) break;
          iVar2 = 0;
          do {
            local_1e8 = -99;
            local_1f8 = -99;
            iVar3 = curl_multi_perform(lVar6,&local_1f4);
            uVar1 = _stderr;
            if (iVar3 == 0) {
              if (local_1f4 < 0) {
                curl_mfprintf(_stderr,
                              "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                              ,0x5f);
                iVar2 = 0x7a;
              }
            }
            else {
              uVar4 = curl_multi_strerror(iVar3);
              curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                            ,0x5f,iVar3,uVar4);
              iVar2 = iVar3;
            }
            iVar3 = 0xc;
            if (iVar2 == 0) {
              tVar10 = tutil_tvnow();
              lVar7 = tutil_tvdiff(tVar10,tv_test_start);
              if (lVar7 < 0x1389) {
                if (local_1f4 == 0) {
                  iVar2 = 0;
                  iVar3 = 0x30;
                }
                else {
                  local_b8.__fds_bits[0xe] = 0;
                  local_b8.__fds_bits[0xf] = 0;
                  local_b8.__fds_bits[0xc] = 0;
                  local_b8.__fds_bits[0xd] = 0;
                  local_b8.__fds_bits[10] = 0;
                  local_b8.__fds_bits[0xb] = 0;
                  local_b8.__fds_bits[8] = 0;
                  local_b8.__fds_bits[9] = 0;
                  local_b8.__fds_bits[6] = 0;
                  local_b8.__fds_bits[7] = 0;
                  local_b8.__fds_bits[4] = 0;
                  local_b8.__fds_bits[5] = 0;
                  local_b8.__fds_bits[2] = 0;
                  local_b8.__fds_bits[3] = 0;
                  local_b8.__fds_bits[0] = 0;
                  local_b8.__fds_bits[1] = 0;
                  local_138.__fds_bits[0] = 0;
                  local_138.__fds_bits[1] = 0;
                  local_138.__fds_bits[2] = 0;
                  local_138.__fds_bits[3] = 0;
                  local_138.__fds_bits[4] = 0;
                  local_138.__fds_bits[5] = 0;
                  local_138.__fds_bits[6] = 0;
                  local_138.__fds_bits[7] = 0;
                  local_138.__fds_bits[8] = 0;
                  local_138.__fds_bits[9] = 0;
                  local_138.__fds_bits[10] = 0;
                  local_138.__fds_bits[0xb] = 0;
                  local_138.__fds_bits[0xc] = 0;
                  local_138.__fds_bits[0xd] = 0;
                  local_138.__fds_bits[0xe] = 0;
                  local_138.__fds_bits[0xf] = 0;
                  local_1b8.__fds_bits[0] = 0;
                  local_1b8.__fds_bits[1] = 0;
                  local_1b8.__fds_bits[2] = 0;
                  local_1b8.__fds_bits[3] = 0;
                  local_1b8.__fds_bits[4] = 0;
                  local_1b8.__fds_bits[5] = 0;
                  local_1b8.__fds_bits[6] = 0;
                  local_1b8.__fds_bits[7] = 0;
                  local_1b8.__fds_bits[8] = 0;
                  local_1b8.__fds_bits[9] = 0;
                  local_1b8.__fds_bits[10] = 0;
                  local_1b8.__fds_bits[0xb] = 0;
                  local_1b8.__fds_bits[0xc] = 0;
                  local_1b8.__fds_bits[0xd] = 0;
                  local_1b8.__fds_bits[0xe] = 0;
                  local_1b8.__fds_bits[0xf] = 0;
                  iVar2 = curl_multi_fdset(lVar6,&local_b8,&local_138,&local_1b8,&local_1f8);
                  uVar1 = _stderr;
                  if (iVar2 == 0) {
                    iVar2 = 0;
                    if (local_1f8 < -1) {
                      curl_mfprintf(_stderr,
                                    "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                                    ,0x6a);
                      iVar2 = 0x7a;
                    }
                  }
                  else {
                    uVar4 = curl_multi_strerror(iVar2);
                    curl_mfprintf(uVar1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                                  ,0x6a,iVar2,uVar4);
                  }
                  if (iVar2 == 0) {
                    iVar2 = curl_multi_timeout(lVar6,&local_1e8);
                    uVar1 = _stderr;
                    if (iVar2 == 0) {
                      iVar2 = 0;
                      if (local_1e8 < -1) {
                        curl_mfprintf(_stderr,
                                      "%s:%d curl_multi_timeout() succeeded, but returned invalid timeout value (%ld)\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                                      ,0x6e);
                        iVar2 = 0x73;
                      }
                    }
                    else {
                      uVar4 = curl_multi_strerror(iVar2);
                      curl_mfprintf(uVar1,"%s:%d curl_multi_timeout() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                                    ,0x6e,iVar2,uVar4);
                    }
                    if (iVar2 == 0) {
                      if (local_1e8 == -1) {
                        local_1e0.tv_sec = 6;
                        local_1e0.tv_usec = 0;
                      }
                      else {
                        lVar7 = local_1e8;
                        if (0x7ffffffe < local_1e8) {
                          lVar7 = 0x7fffffff;
                        }
                        local_1e0.tv_sec = (__time_t)((int)lVar7 / 1000);
                        local_1e0.tv_usec = (__suseconds_t)(((int)lVar7 % 1000) * 1000);
                      }
                      iVar2 = select_wrapper(local_1f8 + 1,&local_b8,&local_138,&local_1b8,
                                             &local_1e0);
                      if (iVar2 == -1) {
                        piVar8 = __errno_location();
                        iVar2 = *piVar8;
                        local_1d0 = _stderr;
                        pcVar9 = strerror(iVar2);
                        curl_mfprintf(local_1d0,"%s:%d select() failed, with errno %d (%s)\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                                      ,0x7d,iVar2,pcVar9);
                        iVar2 = 0x79;
                      }
                      else {
                        tVar10 = tutil_tvnow();
                        lVar7 = tutil_tvdiff(tVar10,tv_test_start);
                        iVar3 = 0;
                        iVar2 = 0;
                        if (5000 < lVar7) {
                          curl_mfprintf(_stderr,
                                        "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                                        ,0x7f);
                          iVar2 = 0x7d;
                          iVar3 = 0xc;
                        }
                      }
                    }
                  }
                }
              }
              else {
                curl_mfprintf(_stderr,
                              "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                              ,0x61);
                iVar2 = 0x7d;
              }
            }
          } while (iVar3 == 0);
          if (iVar3 == 0xc) break;
          if (iVar3 != 0x30) goto LAB_00102b1c;
          lVar7 = curl_multi_info_read(lVar6,local_1bc);
          if (lVar7 != 0) {
            iVar2 = *(int *)(lVar7 + 0x10);
          }
          iVar3 = curl_multi_remove_handle(lVar6,lVar5);
          uVar1 = _stderr;
          if (iVar3 != 0) {
            uVar4 = curl_multi_strerror(iVar3);
            curl_mfprintf(uVar1,"%s:%d curl_multi_remove_handle() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib597.c"
                          ,0x86,iVar3,uVar4);
            iVar2 = iVar3;
          }
          if (iVar2 != 0) break;
          iVar3 = (int)local_1f0;
          local_1f0 = (ulong)(iVar3 + 1);
          iVar2 = 0;
        } while (iVar3 == 0);
      }
    }
    curl_multi_cleanup(lVar6);
    curl_easy_cleanup(lVar5);
    curl_global_cleanup();
  }
LAB_00102b1c:
  return iVar2;
}

Assistant:

int test(char *URL)
{
  CURL *easy = NULL;
  CURLM *multi = NULL;
  int res = 0;
  int running;
  int msgs_left;
  int phase;
  CURLMsg *msg;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(easy);

  multi_init(multi);

  for(phase = CONNECT_ONLY_PHASE; phase < LAST_PHASE; ++phase) {
    /* go verbose */
    easy_setopt(easy, CURLOPT_VERBOSE, 1L);

    /* specify target */
    easy_setopt(easy, CURLOPT_URL, URL);

    /* enable 'CONNECT_ONLY' option when in connect phase */
    if(phase == CONNECT_ONLY_PHASE)
      easy_setopt(easy, CURLOPT_CONNECT_ONLY, 1L);

    /* enable 'NOBODY' option to send 'QUIT' command in quit phase */
    if(phase == QUIT_PHASE) {
      easy_setopt(easy, CURLOPT_CONNECT_ONLY, 0L);
      easy_setopt(easy, CURLOPT_NOBODY, 1L);
      easy_setopt(easy, CURLOPT_FORBID_REUSE, 1L);
    }

    multi_add_handle(multi, easy);

    for(;;) {
      struct timeval interval;
      fd_set fdread;
      fd_set fdwrite;
      fd_set fdexcep;
      long timeout = -99;
      int maxfd = -99;

      multi_perform(multi, &running);

      abort_on_test_timeout();

      if(!running)
        break; /* done */

      FD_ZERO(&fdread);
      FD_ZERO(&fdwrite);
      FD_ZERO(&fdexcep);

      multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

      /* At this point, maxfd is guaranteed to be greater or equal than -1. */

      multi_timeout(multi, &timeout);

      /* At this point, timeout is guaranteed to be greater or equal than
         -1. */

      if(timeout != -1L) {
        int itimeout = (timeout > (long)INT_MAX) ? INT_MAX : (int)timeout;
        interval.tv_sec = itimeout/1000;
        interval.tv_usec = (itimeout%1000)*1000;
      }
      else {
        interval.tv_sec = TEST_HANG_TIMEOUT/1000 + 1;
        interval.tv_usec = 0;
      }

      select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &interval);

      abort_on_test_timeout();
    }

    msg = curl_multi_info_read(multi, &msgs_left);
    if(msg)
      res = msg->data.result;

    multi_remove_handle(multi, easy);
  }

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi);
  curl_easy_cleanup(easy);
  curl_global_cleanup();

  return res;
}